

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool anon_unknown.dwarf_1da1d1::initializeOutputStream
               (char *Buf,size_t *N,OutputStream *S,size_t InitSize)

{
  size_t local_38;
  size_t BufferSize;
  size_t InitSize_local;
  OutputStream *S_local;
  size_t *N_local;
  char *Buf_local;
  
  if (Buf == (char *)0x0) {
    N_local = (size_t *)malloc(InitSize);
    local_38 = InitSize;
    if (N_local == (size_t *)0x0) {
      return true;
    }
  }
  else {
    local_38 = *N;
    N_local = (size_t *)Buf;
  }
  OutputStream::reset(S,(char *)N_local,local_38);
  return false;
}

Assistant:

bool initializeOutputStream(char *Buf, size_t *N, OutputStream &S,
                            size_t InitSize) {
  size_t BufferSize;
  if (Buf == nullptr) {
    Buf = static_cast<char *>(std::malloc(InitSize));
    if (Buf == nullptr)
      return true;
    BufferSize = InitSize;
  } else
    BufferSize = *N;

  S.reset(Buf, BufferSize);
  return false;
}